

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

ON_COMPONENT_INDEX __thiscall
ON_MeshTopology::TopVertexComponentIndex(ON_MeshTopology *this,ON_COMPONENT_INDEX ci)

{
  int iVar1;
  TYPE TVar2;
  ulong uVar3;
  
  uVar3 = (ulong)ci >> 0x20;
  if (ci.m_type == meshtop_vertex) {
    TVar2 = meshtop_vertex;
LAB_00524eb1:
    if ((-1 < (int)uVar3) && ((int)uVar3 < (this->m_topv).m_count)) goto LAB_00524ec6;
  }
  else if (ci.m_type == mesh_vertex) {
    TVar2 = mesh_vertex;
    if ((((-1 < (long)ci) && (this->m_mesh != (ON_Mesh *)0x0)) &&
        (iVar1 = (this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count, ci.m_index < iVar1))
       && (iVar1 == (this->m_topv_map).m_count)) {
      uVar3 = (ulong)(uint)(this->m_topv_map).m_a[uVar3];
      TVar2 = meshtop_vertex;
    }
    goto LAB_00524eb1;
  }
  uVar3 = (ulong)(uint)ON_COMPONENT_INDEX::UnsetComponentIndex.m_index;
  TVar2 = ON_COMPONENT_INDEX::UnsetComponentIndex.m_type;
LAB_00524ec6:
  return (ON_COMPONENT_INDEX)((ulong)TVar2 | uVar3 << 0x20);
}

Assistant:

const ON_COMPONENT_INDEX ON_MeshTopology::TopVertexComponentIndex(
  ON_COMPONENT_INDEX ci
) const
{
  switch (ci.m_type)
  {
  case ON_COMPONENT_INDEX::TYPE::mesh_vertex:
    if (ci.m_index >= 0
      && nullptr != m_mesh 
      && ci.m_index < m_mesh->VertexCount() 
      && m_mesh->VertexCount() == m_topv_map.Count() 
      )
    {
      ci.m_type = ON_COMPONENT_INDEX::TYPE::meshtop_vertex;
      ci.m_index = m_topv_map[ci.m_index];
    }
    // no break here
  case ON_COMPONENT_INDEX::TYPE::meshtop_vertex:
    if (ci.m_index >= 0 && ci.m_index < m_topv.Count())
    {
      return ci;
    }
    break;
          
  default:
    break;
  }

  return ON_COMPONENT_INDEX::UnsetComponentIndex;
}